

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O2

void ra_copy_range(roaring_array_t *ra,uint32_t begin,uint32_t end,uint32_t new_begin)

{
  size_t __n;
  
  __n = (size_t)(int)(end - begin);
  memmove(ra->containers + new_begin,ra->containers + begin,__n * 8);
  memmove(ra->keys + new_begin,ra->keys + begin,__n * 2);
  memmove(ra->typecodes + new_begin,ra->typecodes + begin,__n);
  return;
}

Assistant:

void ra_copy_range(roaring_array_t *ra, uint32_t begin, uint32_t end,
                   uint32_t new_begin) {
    assert(begin <= end);
    assert(new_begin < begin);

    const int range = end - begin;

    // We ensure to previously have freed overwritten containers
    // that are not copied elsewhere

    memmove(&(ra->containers[new_begin]), &(ra->containers[begin]),
            sizeof(container_t *) * range);
    memmove(&(ra->keys[new_begin]), &(ra->keys[begin]),
            sizeof(uint16_t) * range);
    memmove(&(ra->typecodes[new_begin]), &(ra->typecodes[begin]),
            sizeof(uint8_t) * range);
}